

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::SSLVersionTest::ResetContexts(SSLVersionTest *this)

{
  x509_st *pxVar1;
  evp_pkey_st *peVar2;
  ssl_ctx_st *psVar3;
  undefined8 uVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined1 local_40 [16];
  undefined8 local_30;
  
  pxVar1 = (this->cert_)._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
  local_50[0] = (internal)(pxVar1 != (x509_st *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,local_50,(AssertionResult *)"cert_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xabb,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((pointer)local_40._0_8_ != (pointer)&stack0xffffffffffffffd0) {
      operator_delete((void *)local_40._0_8_,local_30 + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  if (pxVar1 != (x509_st *)0x0) {
    peVar2 = (this->key_)._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
    local_50[0] = (internal)(peVar2 != (evp_pkey_st *)0x0);
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_50[0]) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_40,local_50,(AssertionResult *)0x35b51a,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xabc,(char *)local_40._0_8_);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((pointer)local_40._0_8_ != (pointer)&stack0xffffffffffffffd0) {
        operator_delete((void *)local_40._0_8_,local_30 + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    if (peVar2 != (evp_pkey_st *)0x0) {
      CreateContext((SSLVersionTest *)local_40);
      uVar4 = local_40._0_8_;
      local_40._0_8_ = (pointer)0x0;
      std::__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> *)&this->client_ctx_,
                 (pointer)uVar4);
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)local_40);
      psVar3 = (this->client_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
      local_50[0] = (internal)(psVar3 != (ssl_ctx_st *)0x0);
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_50[0]) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_40,local_50,(AssertionResult *)"client_ctx_","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xabe,(char *)local_40._0_8_);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((pointer)local_40._0_8_ != (pointer)&stack0xffffffffffffffd0) {
          operator_delete((void *)local_40._0_8_,local_30 + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      if (psVar3 != (ssl_ctx_st *)0x0) {
        CreateContext((SSLVersionTest *)local_40);
        uVar4 = local_40._0_8_;
        local_40._0_8_ = (char *)0x0;
        std::__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> *)&this->server_ctx_,
                   (pointer)uVar4);
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)local_40);
        psVar3 = (this->server_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
        local_50[0] = (internal)(psVar3 != (ssl_ctx_st *)0x0);
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_50[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_40,local_50,(AssertionResult *)"server_ctx_","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xac0,(char *)local_40._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((undefined8 *)local_40._0_8_ != &stack0xffffffffffffffd0) {
            operator_delete((void *)local_40._0_8_,local_30 + 1);
          }
          if (local_60._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_60._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        if (psVar3 != (ssl_ctx_st *)0x0) {
          local_50[0] = (internal)
                        UseCertAndKey(this,(this->server_ctx_)._M_t.
                                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)
          ;
          local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_50[0]) {
            testing::Message::Message((Message *)&local_60);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_40,local_50,
                       (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xac2,(char *)local_40._0_8_);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((undefined8 *)local_40._0_8_ != &stack0xffffffffffffffd0) {
              operator_delete((void *)local_40._0_8_,local_30 + 1);
            }
            if (local_60._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_60._M_head_impl + 8))();
            }
          }
          if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_48,local_48);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ResetContexts() {
    ASSERT_TRUE(cert_);
    ASSERT_TRUE(key_);
    client_ctx_ = CreateContext();
    ASSERT_TRUE(client_ctx_);
    server_ctx_ = CreateContext();
    ASSERT_TRUE(server_ctx_);
    // Set up a server cert. Client certs can be set up explicitly.
    ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));
  }